

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_generic_iterator_t
xcb_input_device_state_data_resolution_resolution_min_end
          (xcb_input_device_state_t *R,xcb_input_device_state_data_t *S)

{
  void *pvVar1;
  xcb_generic_iterator_t xVar2;
  long lVar3;
  uint *in_RSI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t i;
  int local_28;
  int local_18;
  
  pvVar1 = (void *)(*(long *)(in_RSI + 4) + (ulong)*in_RSI * 4);
  local_18 = (int)pvVar1;
  local_28 = (int)in_RSI;
  lVar3 = (ulong)(uint)(local_18 - local_28) << 0x20;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    xVar2.rem = (int)lVar3;
    xVar2.index = (int)((ulong)lVar3 >> 0x20);
    xVar2.data = pvVar1;
    return xVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_state_data_resolution_resolution_min_end (const xcb_input_device_state_t *R,
                                                           const xcb_input_device_state_data_t *S)
{
    xcb_generic_iterator_t i;
    i.data = S->resolution.resolution_min + S->resolution.num_valuators;
    i.rem = 0;
    i.index = (char *) i.data - (char *) S;
    return i;
}